

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void decode_mmi(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  uint opc_00;
  uint32_t rs_00;
  uint32_t rt_00;
  uint32_t reg;
  int rd;
  int rt;
  int rs;
  uint32_t opc;
  DisasContext_conflict6 *ctx_local;
  CPUMIPSState_conflict8 *env_local;
  
  opc_00 = ctx->opcode & 0xfc00003f;
  rs_00 = extract32(ctx->opcode,0x15,5);
  rt_00 = extract32(ctx->opcode,0x10,5);
  reg = extract32(ctx->opcode,0xb,5);
  switch(opc_00) {
  case 0x70000000:
  case 0x70000001:
  case 0x70000018:
  case 0x70000019:
  case 0x70000020:
  case 0x70000021:
    gen_mul_txx9(ctx,opc_00,reg,rs_00,rt_00);
    break;
  default:
    generate_exception_end(ctx,0x14);
    break;
  case 0x70000004:
  case 0x70000030:
  case 0x70000031:
  case 0x70000034:
  case 0x70000036:
  case 0x70000037:
  case 0x7000003c:
  case 0x7000003e:
  case 0x7000003f:
    generate_exception_end(ctx,0x14);
    break;
  case 0x70000008:
    decode_mmi0(env,ctx);
    break;
  case 0x70000009:
    decode_mmi2(env,ctx);
    break;
  case 0x70000010:
  case 0x70000012:
    gen_HILO1_tx79(ctx,opc_00,reg);
    break;
  case 0x70000011:
  case 0x70000013:
    gen_HILO1_tx79(ctx,opc_00,rs_00);
    break;
  case 0x7000001a:
  case 0x7000001b:
    gen_div1_tx79(ctx,opc_00,rs_00,rt_00);
    break;
  case 0x70000028:
    decode_mmi1(env,ctx);
    break;
  case 0x70000029:
    decode_mmi3(env,ctx);
  }
  return;
}

Assistant:

static void decode_mmi(CPUMIPSState *env, DisasContext *ctx)
{
    uint32_t opc = MASK_MMI(ctx->opcode);
    int rs = extract32(ctx->opcode, 21, 5);
    int rt = extract32(ctx->opcode, 16, 5);
    int rd = extract32(ctx->opcode, 11, 5);

    switch (opc) {
    case MMI_OPC_CLASS_MMI0:
        decode_mmi0(env, ctx);
        break;
    case MMI_OPC_CLASS_MMI1:
        decode_mmi1(env, ctx);
        break;
    case MMI_OPC_CLASS_MMI2:
        decode_mmi2(env, ctx);
        break;
    case MMI_OPC_CLASS_MMI3:
        decode_mmi3(env, ctx);
        break;
    case MMI_OPC_MULT1:
    case MMI_OPC_MULTU1:
    case MMI_OPC_MADD:
    case MMI_OPC_MADDU:
    case MMI_OPC_MADD1:
    case MMI_OPC_MADDU1:
        gen_mul_txx9(ctx, opc, rd, rs, rt);
        break;
    case MMI_OPC_DIV1:
    case MMI_OPC_DIVU1:
        gen_div1_tx79(ctx, opc, rs, rt);
        break;
    case MMI_OPC_MTLO1:
    case MMI_OPC_MTHI1:
        gen_HILO1_tx79(ctx, opc, rs);
        break;
    case MMI_OPC_MFLO1:
    case MMI_OPC_MFHI1:
        gen_HILO1_tx79(ctx, opc, rd);
        break;
    case MMI_OPC_PLZCW:         /* TODO: MMI_OPC_PLZCW */
    case MMI_OPC_PMFHL:         /* TODO: MMI_OPC_PMFHL */
    case MMI_OPC_PMTHL:         /* TODO: MMI_OPC_PMTHL */
    case MMI_OPC_PSLLH:         /* TODO: MMI_OPC_PSLLH */
    case MMI_OPC_PSRLH:         /* TODO: MMI_OPC_PSRLH */
    case MMI_OPC_PSRAH:         /* TODO: MMI_OPC_PSRAH */
    case MMI_OPC_PSLLW:         /* TODO: MMI_OPC_PSLLW */
    case MMI_OPC_PSRLW:         /* TODO: MMI_OPC_PSRLW */
    case MMI_OPC_PSRAW:         /* TODO: MMI_OPC_PSRAW */
        generate_exception_end(ctx, EXCP_RI);    /* TODO: MMI_OPC_CLASS_MMI */
        break;
    default:
        MIPS_INVAL("TX79 MMI class");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}